

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O1

REF_STATUS ref_search_stats(REF_SEARCH ref_search)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  lVar3 = (long)ref_search->n;
  if (lVar3 < 1) {
    uVar2 = 0;
    uVar5 = 0;
    uVar4 = 0;
    uVar1 = 0;
  }
  else {
    lVar6 = 0;
    uVar1 = 0;
    uVar4 = 0;
    uVar5 = 0;
    uVar2 = 0;
    do {
      if (ref_search->item[lVar6] == -1) {
        uVar2 = (ulong)((int)uVar2 + 1);
      }
      else if (ref_search->left[lVar6] == -1) {
        if (ref_search->right[lVar6] != -1) goto LAB_00141e4e;
        uVar1 = (ulong)((int)uVar1 + 1);
      }
      else if (ref_search->right[lVar6] == -1) {
LAB_00141e4e:
        uVar4 = (ulong)((int)uVar4 + 1);
      }
      else {
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar3 != lVar6);
  }
  printf("n %d empty %d zero %d one %d two %d\n",lVar3,uVar2,uVar1,uVar4,uVar5);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_search_stats(REF_SEARCH ref_search) {
  REF_INT i, empty, two, one, zero;
  empty = 0;
  two = 0;
  one = 0;
  zero = 0;
  for (i = 0; i < ref_search->n; i++) {
    if (REF_EMPTY == ref_search->item[i]) {
      empty += 1;
      continue;
    }
    if (REF_EMPTY == ref_search->left[i] && REF_EMPTY == ref_search->right[i]) {
      zero += 1;
      continue;
    }
    if (REF_EMPTY != ref_search->left[i] && REF_EMPTY != ref_search->right[i]) {
      two += 1;
      continue;
    }
    one += 1;
  }
  printf("n %d empty %d zero %d one %d two %d\n", ref_search->n, empty, zero,
         one, two);

  return REF_SUCCESS;
}